

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUtility.cpp
# Opt level: O0

uint8_t GmmIsYUVPacked(GMM_RESOURCE_FORMAT Format)

{
  uint8_t local_d;
  uint8_t Status;
  GMM_RESOURCE_FORMAT Format_local;
  
  if ((((Format - GMM_FORMAT_YCRCB_NORMAL < 4) || (Format == GMM_FORMAT_AYUV)) ||
      (Format - GMM_FORMAT_Y210 < 6)) || (Format - GMM_FORMAT_UYVY_2x1 < 4)) {
    local_d = '\x01';
  }
  else {
    local_d = '\0';
  }
  return local_d;
}

Assistant:

uint8_t GMM_STDCALL GmmIsYUVPacked(GMM_RESOURCE_FORMAT Format)
{
    uint8_t Status = 0;

    switch(Format)
    {
        // YCRCB_xxx Format Supported by the Sampler...
        case GMM_FORMAT_YUY2:
        case GMM_FORMAT_YVYU:
        case GMM_FORMAT_UYVY:
        case GMM_FORMAT_VYUY:
        case GMM_FORMAT_YUY2_2x1:
        case GMM_FORMAT_YVYU_2x1:
        case GMM_FORMAT_UYVY_2x1:
        case GMM_FORMAT_VYUY_2x1:
        case GMM_FORMAT_Y210:
        case GMM_FORMAT_Y212:
        case GMM_FORMAT_Y216:
        case GMM_FORMAT_Y410:
        case GMM_FORMAT_Y412:
        case GMM_FORMAT_Y416:
        case GMM_FORMAT_AYUV:
            Status = 1;
            break;
        default:
            Status = 0;
            break;
    }
    return Status;
}